

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags)

{
  Type *val;
  byte bVar1;
  JavascriptLibrary *library;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  PropertyRecord *scriptContext;
  bool bVar4;
  Flags FVar5;
  unsigned_short uVar6;
  int iVar7;
  BOOL BVar8;
  uint32 uVar9;
  undefined4 *puVar10;
  BigDictionaryTypeHandler *this_00;
  JavascriptFunction *pJVar11;
  JavascriptFunction *pJVar12;
  Var pvVar13;
  byte bVar14;
  char *message;
  char *error;
  uint lineNumber;
  ScriptContext *pSVar15;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar16;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_88;
  Var local_80;
  PropertyRecord *local_78;
  PropertyRecord *propertyRecord;
  PropertyOperationFlags local_64;
  undefined4 local_60;
  undefined4 local_5c;
  JavascriptFunction *local_58;
  JavascriptFunction *local_50;
  DictionaryPropertyDescriptor<unsigned_short> local_48;
  DictionaryPropertyDescriptor<unsigned_short> *local_40;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  local_64 = flags;
  local_58 = (JavascriptFunction *)setter;
  local_50 = (JavascriptFunction *)getter;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x653,"(instance)","instance");
    if (!bVar4) goto LAB_00c25146;
    *puVar10 = 0;
  }
  library = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar15 = (library->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar4 = DynamicTypeHandler::VerifyIsExtensible(&this->super_DynamicTypeHandler,pSVar15,false);
  if (((!bVar4) &&
      (iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x11])
                         (this,instance,(ulong)(uint)propertyId,0,0), iVar7 == 0)) &&
     (bVar4 = JavascriptFunction::IsBuiltinProperty(instance,(PropertyIds)propertyId), !bVar4)) {
    AssertCount = AssertCount + 1;
    propertyRecord = (PropertyRecord *)pSVar15;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x658,
                                "(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId))"
                                ,
                                "this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId)"
                               );
    if (!bVar4) goto LAB_00c25146;
    *puVar10 = 0;
    pSVar15 = (ScriptContext *)propertyRecord;
  }
  iVar7 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar7 + -2 < (int)(uint)this->nextPropertyIndex) {
    if (0xfffc < iVar7) {
      this_00 = ConvertToBigDictionaryTypeHandler(this,instance);
      BVar8 = DictionaryTypeHandlerBase<int>::SetAccessors
                        (this_00,instance,propertyId,local_50,local_58,local_64);
      return BVar8;
    }
    EnsureSlotCapacity(this,instance,2);
  }
  if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
    ScriptContext::InvalidateProtoCaches(pSVar15,propertyId);
  }
  if ((local_50 == (JavascriptFunction *)0x0) ||
     ((library->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == local_50)) {
    local_60 = (undefined4)CONCAT71((int7)((ulong)local_50 >> 8),1);
  }
  else {
    local_60 = 0;
  }
  if ((local_58 == (JavascriptFunction *)0x0) ||
     ((library->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == local_58)) {
    local_5c = (undefined4)CONCAT71((int7)((ulong)local_58 >> 8),1);
  }
  else {
    local_5c = 0;
  }
  propertyRecord = (PropertyRecord *)pSVar15;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x677,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00c25146;
    *puVar10 = 0;
  }
  val = &this->nextPropertyIndex;
  local_78 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_78,&local_40);
  descriptor._4_4_ = propertyId;
  if (bVar4) {
    bVar4 = DictionaryPropertyDescriptor<unsigned_short>::SanityCheckFixedBits(local_40);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x67c,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar4) goto LAB_00c25146;
      *puVar10 = 0;
      propertyId = descriptor._4_4_;
    }
    bVar1 = local_40->Attributes;
    if ((bVar1 & 8) != 0) {
      bVar14 = 7;
      if ((bVar1 & 0x10) != 0) {
        bVar14 = bVar1 & 0xd0 | 7;
      }
      local_40->Attributes = bVar14;
    }
    if ((local_40->flags & IsAccessor) == None) {
      local_50 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_50,library);
      local_58 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_58,library);
    }
    bVar4 = DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter(local_40,val);
    pSVar15 = (ScriptContext *)propertyRecord;
    if ((bVar4) &&
       ((this->super_DynamicTypeHandler).slotCapacity < (int)(uint)this->nextPropertyIndex)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x694,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar4) goto LAB_00c25146;
      *puVar10 = 0;
      propertyId = descriptor._4_4_;
    }
    if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x698,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar4) goto LAB_00c25146;
      *puVar10 = 0;
      propertyId = descriptor._4_4_;
    }
    pRVar2 = (this->singletonInstance).ptr;
    if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      bVar4 = false;
    }
    else if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar4 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x69b,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar4) goto LAB_00c25146;
      *puVar10 = 0;
      bVar4 = false;
      propertyId = descriptor._4_4_;
    }
    FVar5 = local_40->flags;
    if ((FVar5 & IsInitialized) == None) {
      local_40->flags = FVar5 | IsInitialized;
      if (bVar4 && 0xf < (uint)propertyId) {
        BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (((local_64 & PropertyOperation_NonFixedValue) == PropertyOperation_None) && (BVar8 != 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x6a5,
                                      "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                      ,
                                      "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                     );
          if (!bVar4) goto LAB_00c25146;
          *puVar10 = 0;
LAB_00c24f08:
          pDVar16 = local_40;
          bVar4 = DynamicTypeHandler::ShouldFixAccessorProperties();
          FVar5 = bVar4 << 5;
        }
        else {
          if ((local_64 & PropertyOperation_NonFixedValue) == PropertyOperation_None)
          goto LAB_00c24f08;
          FVar5 = None;
          pDVar16 = local_40;
        }
        pDVar16->flags = pDVar16->flags & ~IsFixed | FVar5;
      }
      if ((byte)((byte)local_60 | (byte)local_5c) == 1) {
        local_40->flags = local_40->flags | IsOnlyOneAccessorInitialized;
      }
    }
    else if ((FVar5 & IsOnlyOneAccessorInitialized) == None) {
      InvalidateFixedField<int>(this,instance,propertyId,local_40);
    }
    else {
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_40);
      pJVar11 = (JavascriptFunction *)
                DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,(uint)uVar6);
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_40);
      pJVar12 = (JavascriptFunction *)
                DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,(uint)uVar6);
      if ((((~(byte)local_60 & local_50 != pJVar11) == 0) &&
          (pJVar12 == (library->super_JavascriptLibraryBase).defaultAccessorFunction.ptr)) ||
         (((~(byte)local_5c & local_58 != pJVar12) == 0 &&
          (pJVar11 == (library->super_JavascriptLibraryBase).defaultAccessorFunction.ptr)))) {
        local_40->flags = local_40->flags & ~IsOnlyOneAccessorInitialized;
        pSVar15 = (ScriptContext *)propertyRecord;
      }
      else {
        InvalidateFixedField<int>(this,instance,propertyId,local_40);
        pSVar15 = (ScriptContext *)propertyRecord;
      }
    }
    if (local_50 != (JavascriptFunction *)0x0) {
      pvVar13 = DynamicTypeHandler::CanonicalizeAccessor(local_50,library);
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_40);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,pvVar13);
    }
    if (local_58 != (JavascriptFunction *)0x0) {
      pvVar13 = DynamicTypeHandler::CanonicalizeAccessor(local_58,library);
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_40);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,pvVar13);
    }
    DynamicObject::ChangeType(instance);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &local_48,&library->typesWithOnlyWritablePropertyProtoChain);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
               CONCAT26(local_48.Setter,
                        CONCAT24(local_48.Getter,
                                 CONCAT22(local_48.Data,CONCAT11(local_48.Attributes,local_48.flags)
                                         ))),&this->super_DynamicTypeHandler,'\0',local_78,pSVar15);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              ((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)&local_48,
               &library->typesWithNoSpecialPropertyProtoChain);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)
               CONCAT26(local_48.Setter,
                        CONCAT24(local_48.Getter,
                                 CONCAT22(local_48.Data,CONCAT11(local_48.Attributes,local_48.flags)
                                         ))),&this->super_DynamicTypeHandler,'\0',local_78,pSVar15);
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,descriptor._4_4_,(Var)0x0,SideEffects_Any);
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_40);
    pvVar13 = DynamicObject::GetSlot(instance,(uint)uVar6);
    if (pvVar13 != (Var)0x0) {
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_40);
      pvVar13 = DynamicObject::GetSlot(instance,(uint)uVar6);
      if (pvVar13 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    error = 
    "(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr)"
    ;
    message = 
    "instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr"
    ;
    lineNumber = 0x6d5;
  }
  else {
    if (local_78->isNumeric == true) {
      uVar9 = PropertyRecord::GetNumericValue(local_78);
      iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x30])
                        (this,instance,(ulong)uVar9,local_50,local_58);
      return iVar7;
    }
    local_80 = DynamicTypeHandler::CanonicalizeAccessor(local_50,library);
    local_50 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_58,library);
    uVar6 = ::Math::PostInc<unsigned_short>(val);
    local_48.Setter = ::Math::PostInc<unsigned_short>(val);
    local_48.Attributes = '\a';
    local_48.Data = 0xffff;
    local_48.Getter = uVar6;
    if ((this->super_DynamicTypeHandler).slotCapacity < (int)(uint)this->nextPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e6,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar4) goto LAB_00c25146;
      *puVar10 = 0;
    }
    if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e9,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar4) goto LAB_00c25146;
      *puVar10 = 0;
    }
    pRVar2 = (this->singletonInstance).ptr;
    if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
LAB_00c24c93:
      local_48.flags = IsInitialized|IsAccessor|PreventFalseReference;
    }
    else {
      bVar4 = (DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance;
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x6ec,
                                    "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                    ,
                                    "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                   );
        if (!bVar4) goto LAB_00c25146;
        *puVar10 = 0;
        goto LAB_00c24c93;
      }
      local_48.flags = IsInitialized|IsAccessor|PreventFalseReference;
      if (0xf < descriptor._4_4_ && !bVar4) {
        BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (((local_64 & PropertyOperation_NonFixedValue) == PropertyOperation_None) && (BVar8 != 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x6f1,
                                      "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                      ,
                                      "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                     );
          if (!bVar4) goto LAB_00c25146;
          *puVar10 = 0;
LAB_00c25120:
          bVar4 = DynamicTypeHandler::ShouldFixAccessorProperties();
          FVar5 = bVar4 << 5 | (IsInitialized|IsAccessor|PreventFalseReference);
        }
        else {
          FVar5 = IsInitialized|IsAccessor|PreventFalseReference;
          if ((local_64 & PropertyOperation_NonFixedValue) == PropertyOperation_None)
          goto LAB_00c25120;
        }
        local_48.flags = FVar5;
        if ((byte)((byte)local_60 | (byte)local_5c) == 1) {
          local_48.flags = FVar5 | IsOnlyOneAccessorInitialized;
        }
      }
    }
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)(this->propertyMap).ptr,&local_78,&local_48);
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(&local_48);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,local_80);
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(&local_48);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,local_50);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &local_88,&library->typesWithOnlyWritablePropertyProtoChain);
    scriptContext = propertyRecord;
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_88.ptr,
               &this->super_DynamicTypeHandler,'\0',local_78,(ScriptContext *)propertyRecord);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_88,&library->typesWithNoSpecialPropertyProtoChain);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              (local_88.ptr,&this->super_DynamicTypeHandler,'\0',local_78,
               (ScriptContext *)scriptContext);
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,descriptor._4_4_,(Var)0x0,SideEffects_Any);
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(&local_48);
    pvVar13 = DynamicObject::GetSlot(instance,(uint)uVar6);
    if (pvVar13 != (Var)0x0) {
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(&local_48);
      pvVar13 = DynamicObject::GetSlot(instance,(uint)uVar6);
      if (pvVar13 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    error = 
    "(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr)"
    ;
    message = 
    "instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr"
    ;
    lineNumber = 0x708;
  }
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                              ,lineNumber,error,message);
  if (bVar4) {
    *puVar10 = 0;
    return 1;
  }
LAB_00c25146:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        Assert(instance);
        JavascriptLibrary* library = instance->GetLibrary();
        ScriptContext* scriptContext = instance->GetScriptContext();

        Assert(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId)
            || JavascriptFunction::IsBuiltinProperty(instance, propertyId));

        // We could potentially need 2 new slots to hold getter/setter, try pre-reserve
        if (this->GetSlotCapacity() - 2 < nextPropertyIndex)
        {
            if (this->GetSlotCapacity() > MaxPropertyIndexSize - 2)
            {
                return ConvertToBigDictionaryTypeHandler(instance)
                    ->SetAccessors(instance, propertyId, getter, setter, flags);
            }

            this->EnsureSlotCapacity(instance, 2);
        }

        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->GetFlags() & IsPrototypeFlag)
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }

        bool isGetterSet = true;
        bool isSetterSet = true;
        if (!getter || getter == library->GetDefaultAccessorFunction())
        {
            isGetterSet = false;
        }
        if (!setter || setter == library->GetDefaultAccessorFunction())
        {
            isSetterSet = false;
        }

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
            }

            if (!descriptor->GetIsAccessor())
            {
                // New getter/setter, make sure both values are not null and set to the slots
                getter = CanonicalizeAccessor(getter, library);
                setter = CanonicalizeAccessor(setter, library);
            }

            // conversion from data-property to accessor property
            if (descriptor->ConvertToGetterSetter(nextPropertyIndex))
            {
                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry
            }

            // DictionaryTypeHandlers are not supposed to be shared.
            Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

            // Although we don't actually have CreateTypeForNewScObject on DictionaryTypeHandler, we could potentially
            // transition to a DictionaryTypeHandler with some properties uninitialized.
            if (!descriptor->GetIsInitialized())
            {
                descriptor->SetIsInitialized(true);
                if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
                {
                    // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                    Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);
                    descriptor->SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
                }
                if (!isGetterSet || !isSetterSet)
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(true);
                }
            }
            else if (descriptor->GetIsOnlyOneAccessorInitialized())
            {
                // Only one of getter/setter was initialized, allow the isFixed to stay if we are defining the other one.
                Var oldGetter = GetSlot(instance, descriptor->GetGetterPropertyIndex());
                Var oldSetter = GetSlot(instance, descriptor->GetSetterPropertyIndex());

                if (((getter == oldGetter || !isGetterSet) && oldSetter == library->GetDefaultAccessorFunction()) ||
                    ((setter == oldSetter || !isSetterSet) && oldGetter == library->GetDefaultAccessorFunction()))
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(false);
                }
                else
                {
                    InvalidateFixedField(instance, propertyId, descriptor);
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif

            // don't overwrite an existing accessor with null
            if (getter != nullptr)
            {
                getter = CanonicalizeAccessor(getter, library);
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), getter);
            }
            if (setter != nullptr)
            {
                setter = CanonicalizeAccessor(setter, library);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), setter);
            }
            instance->ChangeType();
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

            // Let's make sure we always have a getter and a setter
            Assert(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr);

            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemAccessors(instance, propertyRecord->GetNumericValue(), getter, setter);
        }

        getter = CanonicalizeAccessor(getter, library);
        setter = CanonicalizeAccessor(setter, library);
        T getterIndex = ::Math::PostInc(nextPropertyIndex);
        T setterIndex = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(getterIndex, setterIndex);
        AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
        newDescriptor.SetIsInitialized(true);
        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
        {
            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
            Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);

            // Even if one (or both?) accessors are the default functions obtained through canonicalization,
            // they are still legitimate functions, so it's ok to mark the whole property as fixed.
            newDescriptor.SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
            if (!isGetterSet || !isSetterSet)
            {
                newDescriptor.SetIsOnlyOneAccessorInitialized(true);
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        SetSlotUnchecked(instance, newDescriptor.GetGetterPropertyIndex(), getter);
        SetSlotUnchecked(instance, newDescriptor.GetSetterPropertyIndex(), setter);

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

        SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

        // Let's make sure we always have a getter and a setter
        Assert(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr);

        return true;
    }